

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd_linux.c
# Opt level: O3

int system_forkfd_pidfd_set_flags(int pidfd,int flags)

{
  uint uVar1;
  
  if ((flags & 1U) == 0) {
    fcntl(pidfd,2,0);
  }
  if ((flags & 2U) != 0) {
    uVar1 = fcntl(pidfd,3);
    fcntl(pidfd,4,(ulong)(uVar1 | 0x800));
  }
  return pidfd;
}

Assistant:

static int system_forkfd_pidfd_set_flags(int pidfd, int flags)
{
    if ((flags & FFD_CLOEXEC) == 0) {
        /* pidfd defaults to O_CLOEXEC */
        fcntl(pidfd, F_SETFD, 0);
    }
    if (flags & FFD_NONBLOCK)
        fcntl(pidfd, F_SETFL, fcntl(pidfd, F_GETFL) | O_NONBLOCK);
    return pidfd;
}